

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
          (WastParser *this,Location loc,Token *token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Type TVar1;
  Expr *pEVar2;
  undefined8 in_RAX;
  Expr *pEVar3;
  undefined8 local_38;
  uint32_t offset;
  uint32_t align;
  
  if (token->token_type_ - AtomicLoad < 0x34) {
    TVar1 = (token->field_2).type_;
    local_38 = in_RAX;
    ParseOffsetOpt(this,(uint32_t *)&local_38);
    ParseAlignOpt(this,(uint32_t *)((long)&local_38 + 4));
    pEVar3 = (Expr *)operator_new(0x48);
    (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar3->_vptr_Expr = (_func_int **)&PTR__Expr_0155b510;
    *(undefined4 *)&(pEVar3->loc).filename.data_ = loc.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar3->loc).filename.data_ + 4) = loc.filename.data_._4_4_;
    *(undefined4 *)&(pEVar3->loc).filename.size_ = (undefined4)loc.filename.size_;
    *(undefined4 *)((long)&(pEVar3->loc).filename.size_ + 4) = loc.filename.size_._4_4_;
    (pEVar3->loc).field_1.field_0.line = loc.field_1.field_0.line;
    (pEVar3->loc).field_1.field_0.first_column = loc.field_1.field_0.first_column;
    (pEVar3->loc).field_1.field_0.last_column = loc.field_1.field_0.last_column;
    *(undefined4 *)((long)&(pEVar3->loc).field_1 + 0xc) = loc.field_1._12_4_;
    pEVar3->type_ = AtomicRmw;
    pEVar3->_vptr_Expr = (_func_int **)&PTR__Expr_0155b580;
    *(Type *)&pEVar3->field_0x3c = TVar1;
    *(undefined4 *)&pEVar3[1]._vptr_Expr = local_38._4_4_;
    *(uint32_t *)((long)&pEVar3[1]._vptr_Expr + 4) = (uint32_t)local_38;
    pEVar2 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar3;
    if (pEVar2 != (Expr *)0x0) {
      (*pEVar2->_vptr_Expr[1])();
    }
    return (Result)Ok;
  }
  __assert_fail("HasOpcode()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                ,0x6b,"Opcode wabt::Token::opcode() const");
}

Assistant:

Result WastParser::ParsePlainLoadStoreInstr(Location loc,
                                            Token token,
                                            std::unique_ptr<Expr>* out_expr) {
  Opcode opcode = token.opcode();
  uint32_t offset;
  uint32_t align;
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);
  out_expr->reset(new T(opcode, align, offset, loc));
  return Result::Ok;
}